

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O1

void testing::internal::XmlUnitTestResultPrinter::PrintXmlUnitTest
               (ostream *stream,UnitTest *unit_test)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer ppTVar3;
  pointer ppTVar4;
  ostream *poVar5;
  pointer ppTVar6;
  TimeInMillis ms;
  TimeInMillis ms_00;
  TestResult *extraout_RDX;
  TestResult *extraout_RDX_00;
  TestResult *extraout_RDX_01;
  TestResult *extraout_RDX_02;
  TestResult *extraout_RDX_03;
  TestResult *extraout_RDX_04;
  TestResult *result;
  int iVar7;
  uint uVar8;
  long lVar9;
  string kTestsuites;
  int local_94;
  string local_90;
  string local_70;
  string local_50;
  
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"testsuites","");
  std::__ostream_insert<char,std::char_traits<char>>
            (stream,"<?xml version=\"1.0\" encoding=\"UTF-8\"?>\n",0x27);
  std::__ostream_insert<char,std::char_traits<char>>(stream,"<",1);
  std::__ostream_insert<char,std::char_traits<char>>
            (stream,local_70._M_dataplus._M_p,local_70._M_string_length);
  paVar1 = &local_90.field_2;
  local_90._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"tests","");
  local_94 = UnitTestImpl::reportable_test_count(unit_test->impl_);
  StreamableToString<int>(&local_50,&local_94);
  OutputXmlAttribute(stream,&local_70,&local_90,&local_50);
  paVar2 = &local_50.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != paVar1) {
    operator_delete(local_90._M_dataplus._M_p);
  }
  local_90._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"failures","");
  local_94 = UnitTestImpl::failed_test_count(unit_test->impl_);
  StreamableToString<int>(&local_50,&local_94);
  OutputXmlAttribute(stream,&local_70,&local_90,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != paVar1) {
    operator_delete(local_90._M_dataplus._M_p);
  }
  local_90._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"disabled","");
  local_94 = UnitTestImpl::reportable_disabled_test_count(unit_test->impl_);
  StreamableToString<int>(&local_50,&local_94);
  OutputXmlAttribute(stream,&local_70,&local_90,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != paVar1) {
    operator_delete(local_90._M_dataplus._M_p);
  }
  local_90._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"errors","");
  local_50._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"0","");
  OutputXmlAttribute(stream,&local_70,&local_90,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != paVar1) {
    operator_delete(local_90._M_dataplus._M_p);
  }
  local_90._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"timestamp","");
  FormatEpochTimeInMillisAsIso8601_abi_cxx11_
            (&local_50,(internal *)unit_test->impl_->start_timestamp_,ms);
  OutputXmlAttribute(stream,&local_70,&local_90,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != paVar1) {
    operator_delete(local_90._M_dataplus._M_p);
  }
  local_90._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"time","");
  FormatTimeInMillisAsSeconds_abi_cxx11_
            (&local_50,(internal *)unit_test->impl_->elapsed_time_,ms_00);
  OutputXmlAttribute(stream,&local_70,&local_90,&local_50);
  result = extraout_RDX;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar2) {
    operator_delete(local_50._M_dataplus._M_p);
    result = extraout_RDX_00;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != paVar1) {
    operator_delete(local_90._M_dataplus._M_p);
    result = extraout_RDX_01;
  }
  if (FLAGS_gtest_shuffle == '\x01') {
    local_90._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"random_seed","");
    local_94 = unit_test->impl_->random_seed_;
    StreamableToString<int>(&local_50,&local_94);
    OutputXmlAttribute(stream,&local_70,&local_90,&local_50);
    result = extraout_RDX_02;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != paVar2) {
      operator_delete(local_50._M_dataplus._M_p);
      result = extraout_RDX_03;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != paVar1) {
      operator_delete(local_90._M_dataplus._M_p);
      result = extraout_RDX_04;
    }
  }
  TestPropertiesAsXmlAttributes_abi_cxx11_
            (&local_90,(XmlUnitTestResultPrinter *)&unit_test->impl_->ad_hoc_test_result_,result);
  std::__ostream_insert<char,std::char_traits<char>>
            (stream,local_90._M_dataplus._M_p,local_90._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != paVar1) {
    operator_delete(local_90._M_dataplus._M_p);
  }
  local_90._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"name","");
  local_50._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"AllTests","");
  OutputXmlAttribute(stream,&local_70,&local_90,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != paVar1) {
    operator_delete(local_90._M_dataplus._M_p);
  }
  std::__ostream_insert<char,std::char_traits<char>>(stream,">\n",2);
  ppTVar4 = (unit_test->impl_->test_cases_).
            super__Vector_base<testing::TestCase_*,_std::allocator<testing::TestCase_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (0 < (int)((ulong)((long)(unit_test->impl_->test_cases_).
                              super__Vector_base<testing::TestCase_*,_std::allocator<testing::TestCase_*>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)ppTVar4) >> 3)) {
    lVar9 = 0;
    do {
      ppTVar6 = (ppTVar4[lVar9]->test_info_list_).
                super__Vector_base<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
      ppTVar3 = *(pointer *)
                 ((long)&(ppTVar4[lVar9]->test_info_list_).
                         super__Vector_base<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>
                         ._M_impl + 8);
      if (ppTVar6 != ppTVar3) {
        iVar7 = 0;
        do {
          uVar8 = (*ppTVar6)->is_in_another_shard_ ^ 1;
          if ((*ppTVar6)->matches_filter_ == false) {
            uVar8 = 0;
          }
          iVar7 = iVar7 + uVar8;
          ppTVar6 = ppTVar6 + 1;
        } while (ppTVar6 != ppTVar3);
        if (iVar7 != 0) {
          PrintXmlTestCase(stream,ppTVar4[lVar9]);
        }
      }
      lVar9 = lVar9 + 1;
      ppTVar4 = (unit_test->impl_->test_cases_).
                super__Vector_base<testing::TestCase_*,_std::allocator<testing::TestCase_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
    } while (lVar9 < (int)((ulong)((long)(unit_test->impl_->test_cases_).
                                         super__Vector_base<testing::TestCase_*,_std::allocator<testing::TestCase_*>_>
                                         ._M_impl.super__Vector_impl_data._M_finish - (long)ppTVar4)
                          >> 3));
  }
  std::__ostream_insert<char,std::char_traits<char>>(stream,"</",2);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (stream,local_70._M_dataplus._M_p,local_70._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,">\n",2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  return;
}

Assistant:

void XmlUnitTestResultPrinter::PrintXmlUnitTest(std::ostream* stream,
                                                const UnitTest& unit_test) {
  const std::string kTestsuites = "testsuites";

  *stream << "<?xml version=\"1.0\" encoding=\"UTF-8\"?>\n";
  *stream << "<" << kTestsuites;

  OutputXmlAttribute(stream, kTestsuites, "tests",
                     StreamableToString(unit_test.reportable_test_count()));
  OutputXmlAttribute(stream, kTestsuites, "failures",
                     StreamableToString(unit_test.failed_test_count()));
  OutputXmlAttribute(
      stream, kTestsuites, "disabled",
      StreamableToString(unit_test.reportable_disabled_test_count()));
  OutputXmlAttribute(stream, kTestsuites, "errors", "0");
  OutputXmlAttribute(
      stream, kTestsuites, "timestamp",
      FormatEpochTimeInMillisAsIso8601(unit_test.start_timestamp()));
  OutputXmlAttribute(stream, kTestsuites, "time",
                     FormatTimeInMillisAsSeconds(unit_test.elapsed_time()));

  if (GTEST_FLAG(shuffle)) {
    OutputXmlAttribute(stream, kTestsuites, "random_seed",
                       StreamableToString(unit_test.random_seed()));
  }
  *stream << TestPropertiesAsXmlAttributes(unit_test.ad_hoc_test_result());

  OutputXmlAttribute(stream, kTestsuites, "name", "AllTests");
  *stream << ">\n";

  for (int i = 0; i < unit_test.total_test_case_count(); ++i) {
    if (unit_test.GetTestCase(i)->reportable_test_count() > 0)
      PrintXmlTestCase(stream, *unit_test.GetTestCase(i));
  }
  *stream << "</" << kTestsuites << ">\n";
}